

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void intra_mode_cnn_partition
               (AV1_COMMON *cm,MACROBLOCK *x,int quad_tree_idx,int intra_cnn_based_part_prune_level,
               PartitionSearchState *part_state)

{
  int iVar1;
  NN_CONFIG *pNVar2;
  _Bool _Var3;
  int16_t iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  PartitionSearchState *in_R8;
  float fVar9;
  float no_split_thresh;
  float split_only_thresh;
  int is_480p_or_larger;
  int is_720p_or_larger;
  int ch_idx_6;
  int spa_stride_3;
  int curr_lin_idx_2;
  int ch_idx_5;
  int prev_spa_stride_1;
  int prev_lin_idx_1;
  int prev_quad_idx_1;
  int f_idx_3;
  int ch_idx_4;
  int spa_stride_2;
  int curr_lin_idx_1;
  int ch_idx_3;
  int prev_spa_stride;
  int prev_lin_idx;
  int prev_quad_idx;
  int f_idx_2;
  int ch_idx_2;
  int spa_stride_1;
  int curr_lin_idx;
  int idx;
  int f_idx_1;
  int ch_idx_1;
  int lin_idx;
  int spa_stride;
  int ch_idx;
  int f_idx;
  float *branch_3;
  float *branch_2;
  float *branch_1;
  float *branch_0;
  float logits [4];
  float dnn_features [100];
  NN_CONFIG *dnn_config;
  NN_CONFIG *dnn_configs [5];
  uint8_t *image_1 [1];
  uint16_t *image [1];
  int stride;
  int height;
  int width;
  int dc_q;
  int bit_depth;
  MACROBLOCKD *xd;
  CNN_MULTI_OUT output;
  int ch;
  int ch_size;
  int num_chs;
  int output_idx;
  float *curr_buf_ptr;
  float **cur_output_buf;
  float *output_buffer [64];
  int out_chs [4];
  int output_dims [4];
  int num_outputs;
  CNN_THREAD_DATA thread_data;
  CNN_CONFIG *cnn_config;
  PartitionSearchInfo *part_info;
  int bsize_idx;
  BLOCK_SIZE bsize;
  PartitionBlkParams *blk_params;
  undefined8 in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa90;
  int local_568;
  int local_564;
  float local_560;
  float local_55c;
  int local_550;
  int local_544;
  int local_534;
  int local_530;
  int local_524;
  int local_514;
  int local_510;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f0;
  int local_4ec;
  float local_4c8 [4];
  float local_4b8 [2];
  undefined8 local_318 [6];
  long local_2e8;
  long local_2e0;
  int local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  int local_2c8;
  undefined4 local_2c4;
  long local_2c0;
  undefined4 local_2b8;
  int *local_2b0;
  undefined8 *local_2a8;
  undefined1 *local_2a0;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  long local_288;
  undefined1 *local_280;
  undefined1 local_278 [512];
  int local_78 [4];
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 local_48;
  CNN_CONFIG *local_40;
  long local_38;
  int local_30;
  BLOCK_SIZE local_29;
  PartitionBlkParams *local_28;
  PartitionSearchState *local_20;
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_28 = &in_R8->part_blk_params;
  local_29 = (in_R8->part_blk_params).bsize;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = convert_bsize_to_idx(local_29);
  if (local_29 == BLOCK_128X128) {
    return;
  }
  local_38 = local_10 + 0x17204;
  if ((local_29 == BLOCK_64X64) && (*(int *)(local_10 + 0x17208) == 0)) {
    local_40 = &av1_intra_mode_cnn_partition_cnn_config;
    local_50 = 1;
    local_48 = 0;
    local_54 = 4;
    local_68 = 0x200000001;
    local_60 = 0x800000004;
    local_78[0] = 0x14;
    local_78[1] = 4;
    local_78[2] = 0x14;
    local_78[3] = 0x14;
    local_280 = local_278;
    local_288 = local_10 + 0x1720c;
    for (local_28c = 0; local_28c < 4; local_28c = local_28c + 1) {
      local_290 = local_78[local_28c];
      local_294 = *(int *)((long)&local_68 + (long)local_28c * 4) *
                  *(int *)((long)&local_68 + (long)local_28c * 4);
      for (local_298 = 0; local_298 < local_290; local_298 = local_298 + 1) {
        *(long *)(local_280 + (long)local_298 * 8) = local_288;
        local_288 = local_288 + (long)local_294 * 4;
      }
      local_280 = local_280 + (long)local_290 * 8;
    }
    local_2b8 = 4;
    local_2b0 = local_78;
    local_2a8 = &local_68;
    local_2a0 = local_278;
    local_2c0 = local_10 + 0x1a0;
    local_2c4 = *(undefined4 *)(local_10 + 0x2b40);
    iVar4 = av1_dc_quant_QTX(in_stack_fffffffffffffa90,
                             (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),
                             (aom_bit_depth_t)in_stack_fffffffffffffa88);
    local_2c8 = (int)iVar4 >> ((char)local_2c4 - 8U & 0x1f);
    fVar9 = log1pf((float)(local_2c8 * local_2c8) / 256.0);
    *(float *)(local_38 + 0x1998) = fVar9;
    *(float *)(local_38 + 0x1998) = (*(float *)(local_38 + 0x1998) - 1.191922) / 1.730044;
    local_2cc = 0x41;
    local_2d0 = 0x41;
    local_2d4 = *(int *)(local_10 + 0x48);
    if ((*(uint *)(*(long *)(local_2c0 + 0x1f18) + 0xc0) & 8) == 0) {
      local_2e8 = (*(long *)(local_10 + 0x30) - (long)local_2d4) + -1;
      _Var3 = av1_cnn_predict_img_multi_out
                        ((uint8_t **)output_buffer[1],output_buffer[0]._4_4_,(int)output_buffer[0],
                         cur_output_buf._4_4_,(CNN_CONFIG *)curr_buf_ptr,_num_chs,
                         (CNN_MULTI_OUT *)CONCAT44(output_buffer[4]._4_4_,(int)output_buffer[4]));
      if (!_Var3) {
        aom_internal_error(*(aom_internal_error_info **)(local_2c0 + 0x29f0),AOM_CODEC_MEM_ERROR,
                           "Error allocating CNN data");
        return;
      }
    }
    else {
      local_2e0 = *(long *)(local_10 + 0x30) * 2 + (long)local_2d4 * -2 + -2;
      _Var3 = av1_cnn_predict_img_multi_out_highbd
                        ((uint16_t **)output_buffer[1],output_buffer[0]._4_4_,(int)output_buffer[0],
                         cur_output_buf._4_4_,(CNN_CONFIG *)curr_buf_ptr,_num_chs,
                         (int)output_buffer[4],(CNN_MULTI_OUT *)output_buffer[5]);
      if (!_Var3) {
        aom_internal_error(*(aom_internal_error_info **)(local_2c0 + 0x29f0),AOM_CODEC_MEM_ERROR,
                           "Error allocating CNN data");
        return;
      }
    }
    *(undefined4 *)(local_38 + 4) = 1;
  }
  if (*(int *)(local_38 + 4) != 0) {
    memcpy(local_318,&DAT_00c96100,0x28);
    pNVar2 = (NN_CONFIG *)local_318[local_30];
    memset(local_4c8,0,0x10);
    lVar5 = local_38 + 8;
    lVar6 = local_38 + 0x58;
    lVar7 = local_38 + 0x98;
    lVar8 = local_38 + 0x598;
    if (local_29 == BLOCK_64X64) {
      local_4ec = 0;
      for (local_4f0 = 0; local_4f0 < 0x14; local_4f0 = local_4f0 + 1) {
        local_4b8[local_4ec] = *(float *)(lVar5 + (long)local_4f0 * 4);
        local_4ec = local_4ec + 1;
      }
      for (local_4f8 = 0; local_4f8 < 4; local_4f8 = local_4f8 + 1) {
        for (local_4fc = 0; local_4fc < 4; local_4fc = local_4fc + 1) {
          local_4b8[local_4ec] = *(float *)(lVar6 + (long)(local_4f8 + local_4fc * 4) * 4);
          local_4ec = local_4ec + 1;
        }
      }
      local_4b8[local_4ec] = *(float *)(local_38 + 0x1998);
    }
    else if (local_29 == BLOCK_32X32) {
      local_500 = 0;
      for (local_504 = 0; local_504 < 0x14; local_504 = local_504 + 1) {
        local_4b8[local_500] = *(float *)(lVar5 + (long)local_504 * 4);
        local_500 = local_500 + 1;
      }
      iVar1 = quad_to_linear_1[local_14 + -1];
      for (local_510 = 0; local_510 < 4; local_510 = local_510 + 1) {
        local_4b8[local_500] = *(float *)(lVar6 + (long)(iVar1 + local_510 * 4) * 4);
        local_500 = local_500 + 1;
      }
      local_4b8[local_500] = *(float *)(local_38 + 0x1998);
    }
    else if (local_29 == BLOCK_16X16) {
      local_514 = 0;
      iVar1 = quad_to_linear_1[(local_14 + -1) / 4 + -1];
      for (local_524 = 0; local_524 < 4; local_524 = local_524 + 1) {
        local_4b8[local_514] = *(float *)(lVar6 + (long)(iVar1 + local_524 * 4) * 4);
        local_514 = local_514 + 1;
      }
      iVar1 = quad_to_linear_2[local_14 + -5];
      for (local_530 = 0; local_530 < 0x14; local_530 = local_530 + 1) {
        local_4b8[local_514] = *(float *)(lVar7 + (long)(iVar1 + local_530 * 0x10) * 4);
        local_514 = local_514 + 1;
      }
      local_4b8[local_514] = *(float *)(local_38 + 0x1998);
    }
    else if (local_29 == BLOCK_8X8) {
      local_534 = 0;
      iVar1 = quad_to_linear_2[(local_14 + -1) / 4 + -5];
      for (local_544 = 0; local_544 < 0x14; local_544 = local_544 + 1) {
        local_4b8[local_534] = *(float *)(lVar7 + (long)(iVar1 + local_544 * 0x10) * 4);
        local_534 = local_534 + 1;
      }
      iVar1 = quad_to_linear_3[local_14 + -0x15];
      for (local_550 = 0; local_550 < 0x14; local_550 = local_550 + 1) {
        local_4b8[local_534] = *(float *)(lVar8 + (long)(iVar1 + local_550 * 0x40) * 4);
        local_534 = local_534 + 1;
      }
      local_4b8[local_534] = *(float *)(local_38 + 0x1998);
    }
    (*av1_nn_predict)(local_4b8,pNVar2,1,local_4c8);
    if (*(int *)(local_8 + 0x38) < *(int *)(local_8 + 0x3c)) {
      local_564 = *(int *)(local_8 + 0x38);
    }
    else {
      local_564 = *(int *)(local_8 + 0x3c);
    }
    if (*(int *)(local_8 + 0x38) < *(int *)(local_8 + 0x3c)) {
      local_568 = *(int *)(local_8 + 0x38);
    }
    else {
      local_568 = *(int *)(local_8 + 0x3c);
    }
    if (local_564 < 0x2d0) {
      if (local_568 < 0x1e0) {
        local_55c = av1_intra_mode_cnn_partition_split_thresh_lowres[local_30];
        local_560 = av1_intra_mode_cnn_partition_no_split_thresh_lowres[local_30];
      }
      else {
        local_55c = av1_intra_mode_cnn_partition_split_thresh_midres[local_30];
        local_560 = av1_intra_mode_cnn_partition_no_split_thresh_midres[local_30];
      }
    }
    else {
      local_55c = av1_intra_mode_cnn_partition_split_thresh_hdres[local_30];
      local_560 = av1_intra_mode_cnn_partition_no_split_thresh_hdres[local_30];
    }
    if (local_55c < local_4c8[0]) {
      if (local_18 != 1) {
        local_20->partition_none_allowed = 0;
      }
      local_20->do_square_split = 1;
      av1_disable_rect_partitions(local_20);
    }
    if (local_4c8[0] < local_560) {
      av1_disable_square_split_partition(local_20);
    }
  }
  return;
}

Assistant:

static void intra_mode_cnn_partition(const AV1_COMMON *const cm, MACROBLOCK *x,
                                     int quad_tree_idx,
                                     int intra_cnn_based_part_prune_level,
                                     PartitionSearchState *part_state) {
  assert(cm->seq_params->sb_size >= BLOCK_64X64 &&
         "Invalid sb_size for intra_cnn!");
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const BLOCK_SIZE bsize = blk_params->bsize;

  const int bsize_idx = convert_bsize_to_idx(bsize);

  if (bsize == BLOCK_128X128) {
    return;
  }

  PartitionSearchInfo *part_info = &x->part_search_info;

  // Precompute the CNN part and cache the result in MACROBLOCK
  if (bsize == BLOCK_64X64 && !part_info->cnn_output_valid) {
    const CNN_CONFIG *cnn_config = &av1_intra_mode_cnn_partition_cnn_config;

    // Prepare the output
    const CNN_THREAD_DATA thread_data = { .num_workers = 1, .workers = NULL };
    const int num_outputs = 4;
    const int output_dims[4] = { 1, 2, 4, 8 };
    const int out_chs[4] = { CNN_BRANCH_0_OUT_CH, CNN_BRANCH_1_OUT_CH,
                             CNN_BRANCH_2_OUT_CH, CNN_BRANCH_3_OUT_CH };
    float *output_buffer[CNN_TOT_OUT_CH];

    float **cur_output_buf = output_buffer;
    float *curr_buf_ptr = part_info->cnn_buffer;
    for (int output_idx = 0; output_idx < num_outputs; output_idx++) {
      const int num_chs = out_chs[output_idx];
      const int ch_size = output_dims[output_idx] * output_dims[output_idx];
      for (int ch = 0; ch < num_chs; ch++) {
        cur_output_buf[ch] = curr_buf_ptr;
        curr_buf_ptr += ch_size;
      }
      cur_output_buf += num_chs;
    }

    CNN_MULTI_OUT output = {
      .num_outputs = 4,
      .output_channels = out_chs,
      .output_strides = output_dims,
      .output_buffer = output_buffer,
    };

    // Prepare the input
    const MACROBLOCKD *xd = &x->e_mbd;
    const int bit_depth = xd->bd;
    const int dc_q =
        av1_dc_quant_QTX(x->qindex, 0, bit_depth) >> (bit_depth - 8);
    part_info->log_q = log1pf((float)(dc_q * dc_q) / 256.0f);
    part_info->log_q =
        (part_info->log_q - av1_intra_mode_cnn_partition_mean[0]) /
        av1_intra_mode_cnn_partition_std[0];

    const int width = 65, height = 65,
              stride = x->plane[AOM_PLANE_Y].src.stride;

    if (xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH) {
      uint16_t *image[1] = {
        CONVERT_TO_SHORTPTR(x->plane[AOM_PLANE_Y].src.buf) - stride - 1
      };

      if (!av1_cnn_predict_img_multi_out_highbd(image, width, height, stride,
                                                cnn_config, &thread_data,
                                                bit_depth, &output)) {
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Error allocating CNN data");
        return;
      }
    } else {
      uint8_t *image[1] = { x->plane[AOM_PLANE_Y].src.buf - stride - 1 };

      if (!av1_cnn_predict_img_multi_out(image, width, height, stride,
                                         cnn_config, &thread_data, &output)) {
        aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                           "Error allocating CNN data");
        return;
      }
    }

    part_info->cnn_output_valid = 1;
  }

  if (!part_info->cnn_output_valid) {
    return;
  }

  const NN_CONFIG *dnn_configs[5] = {
    NULL,
    &av1_intra_mode_cnn_partition_branch_0_dnn_config,
    &av1_intra_mode_cnn_partition_branch_1_dnn_config,
    &av1_intra_mode_cnn_partition_branch_2_dnn_config,
    &av1_intra_mode_cnn_partition_branch_3_dnn_config,
  };

  const NN_CONFIG *dnn_config = dnn_configs[bsize_idx];

  float dnn_features[100];
  float logits[4] = { 0.0f };

  const float *branch_0 = part_info->cnn_buffer;
  const float *branch_1 = branch_0 + CNN_BRANCH_0_OUT_SIZE;
  const float *branch_2 = branch_1 + CNN_BRANCH_1_OUT_SIZE;
  const float *branch_3 = branch_2 + CNN_BRANCH_2_OUT_SIZE;

  if (bsize == BLOCK_64X64) {
    int f_idx = 0;
    for (int ch_idx = 0; ch_idx < CNN_BRANCH_0_OUT_CH; ch_idx++) {
      dnn_features[f_idx++] = branch_0[ch_idx];
    }

    const int spa_stride = 2 * 2;
    for (int lin_idx = 0; lin_idx < spa_stride; lin_idx++) {
      for (int ch_idx = 0; ch_idx < CNN_BRANCH_1_OUT_CH; ch_idx++) {
        dnn_features[f_idx++] = branch_1[lin_idx + ch_idx * spa_stride];
      }
    }
    dnn_features[f_idx++] = part_info->log_q;
  } else if (bsize == BLOCK_32X32) {
    int f_idx = 0;
    for (int idx = 0; idx < CNN_BRANCH_0_OUT_CH; idx++) {
      dnn_features[f_idx++] = branch_0[idx];
    }

    const int curr_lin_idx = quad_to_linear_1[quad_tree_idx - 1];
    const int spa_stride = 2 * 2;
    for (int ch_idx = 0; ch_idx < CNN_BRANCH_1_OUT_CH; ch_idx++) {
      dnn_features[f_idx++] = branch_1[curr_lin_idx + ch_idx * spa_stride];
    }
    dnn_features[f_idx++] = part_info->log_q;
  } else if (bsize == BLOCK_16X16) {
    int f_idx = 0;
    const int prev_quad_idx = (quad_tree_idx - 1) / 4;
    const int prev_lin_idx = quad_to_linear_1[prev_quad_idx - 1];
    const int prev_spa_stride = 2 * 2;
    for (int ch_idx = 0; ch_idx < CNN_BRANCH_1_OUT_CH; ch_idx++) {
      dnn_features[f_idx++] = branch_1[prev_lin_idx + ch_idx * prev_spa_stride];
    }

    const int curr_lin_idx = quad_to_linear_2[quad_tree_idx - 5];
    const int spa_stride = 4 * 4;
    for (int ch_idx = 0; ch_idx < CNN_BRANCH_2_OUT_CH; ch_idx++) {
      dnn_features[f_idx++] = branch_2[curr_lin_idx + ch_idx * spa_stride];
    }
    dnn_features[f_idx++] = part_info->log_q;
  } else if (bsize == BLOCK_8X8) {
    int f_idx = 0;
    const int prev_quad_idx = (quad_tree_idx - 1) / 4;
    const int prev_lin_idx = quad_to_linear_2[prev_quad_idx - 5];
    const int prev_spa_stride = 4 * 4;
    for (int ch_idx = 0; ch_idx < CNN_BRANCH_2_OUT_CH; ch_idx++) {
      dnn_features[f_idx++] = branch_2[prev_lin_idx + ch_idx * prev_spa_stride];
    }

    const int curr_lin_idx = quad_to_linear_3[quad_tree_idx - 21];
    const int spa_stride = 8 * 8;
    for (int ch_idx = 0; ch_idx < CNN_BRANCH_3_OUT_CH; ch_idx++) {
      dnn_features[f_idx++] = branch_3[curr_lin_idx + ch_idx * spa_stride];
    }
    dnn_features[f_idx++] = part_info->log_q;
  } else {
    assert(0 && "Invalid bsize in intra_cnn partition");
  }

  // Make decision
  av1_nn_predict(dnn_features, dnn_config, 1, logits);

  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  float split_only_thresh = 100.0f, no_split_thresh = -100.0f;
  if (is_720p_or_larger) {
    split_only_thresh =
        av1_intra_mode_cnn_partition_split_thresh_hdres[bsize_idx];
    no_split_thresh =
        av1_intra_mode_cnn_partition_no_split_thresh_hdres[bsize_idx];
  } else if (is_480p_or_larger) {
    split_only_thresh =
        av1_intra_mode_cnn_partition_split_thresh_midres[bsize_idx];
    no_split_thresh =
        av1_intra_mode_cnn_partition_no_split_thresh_midres[bsize_idx];
  } else {
    split_only_thresh =
        av1_intra_mode_cnn_partition_split_thresh_lowres[bsize_idx];
    no_split_thresh =
        av1_intra_mode_cnn_partition_no_split_thresh_lowres[bsize_idx];
  }

  if (logits[0] > split_only_thresh) {
    // As screen contents tend to choose larger partitions, do not prune
    // PARTITION_NONE when intra_cnn_based_part_prune_level=1.
    if (intra_cnn_based_part_prune_level != 1) {
      part_state->partition_none_allowed = 0;
    }
    part_state->do_square_split = 1;
    av1_disable_rect_partitions(part_state);
  }

  if (logits[0] < no_split_thresh) {
    av1_disable_square_split_partition(part_state);
  }
}